

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

_Bool fiber_alloc(Fiber *fbr,size_t size,FiberCleanupFunc cleanup,void *arg,FiberFlags flags)

{
  _Bool _Var1;
  void *pvVar2;
  size_t align;
  ulong local_50;
  size_t npages;
  size_t pgsz;
  size_t stack_size;
  FiberFlags flags_local;
  void *arg_local;
  FiberCleanupFunc cleanup_local;
  size_t size_local;
  Fiber *fbr_local;
  
  fbr->stack_size = size;
  if ((flags & 0x18) == 0) {
    pvVar2 = malloc(size);
    fbr->stack = pvVar2;
    fbr->alloc_stack = pvVar2;
    if (fbr->alloc_stack == (void *)0x0) {
      return false;
    }
  }
  else {
    align = get_page_size();
    local_50 = ((size + align) - 1) / align;
    if ((flags & 8) != 0) {
      local_50 = local_50 + 1;
    }
    if ((flags & 0x10) != 0) {
      local_50 = local_50 + 1;
    }
    pvVar2 = alloc_aligned_chunks(local_50,align);
    fbr->alloc_stack = pvVar2;
    if (fbr->alloc_stack == (void *)0x0) {
      return false;
    }
    if ((((flags & 8) != 0) &&
        (_Var1 = protect_page(fbr->alloc_stack,false), ((_Var1 ^ 0xffU) & 1) != 0)) ||
       (((flags & 0x10) != 0 &&
        (_Var1 = protect_page((void *)((long)fbr->alloc_stack + (local_50 - 1) * align),false),
        ((_Var1 ^ 0xffU) & 1) != 0)))) {
      free_pages(fbr->alloc_stack);
      return false;
    }
    if ((flags & 8) == 0) {
      fbr->stack = fbr->alloc_stack;
    }
    else {
      fbr->stack = (void *)((long)fbr->alloc_stack + align);
    }
  }
  fbr->state = flags & 0x18;
  fiber_init_(fbr,cleanup,arg);
  return true;
}

Assistant:

bool
fiber_alloc(Fiber *fbr,
            size_t size,
            FiberCleanupFunc cleanup,
            void *arg,
            FiberFlags flags)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    flags &= FIBER_FLAG_GUARD_LO | FIBER_FLAG_GUARD_HI;
    fbr->stack_size = size;
    const size_t stack_size = size;

    if (!flags) {
        fbr->alloc_stack = fbr->stack = malloc(stack_size);
        if (!fbr->alloc_stack)
            return false;
    } else {
        size_t pgsz = get_page_size();
        size_t npages = (size + pgsz - 1) / pgsz;
        if (flags & FIBER_FLAG_GUARD_LO)
            ++npages;
        if (flags & FIBER_FLAG_GUARD_HI)
            ++npages;
        fbr->alloc_stack = alloc_aligned_chunks(npages, pgsz);
        if (hu_unlikely(!fbr->alloc_stack))
            return false;

        if (flags & FIBER_FLAG_GUARD_LO)
            if (hu_unlikely(!protect_page(fbr->alloc_stack, false)))
                goto fail;

        if (flags & FIBER_FLAG_GUARD_HI)
            if (hu_unlikely(!protect_page(
                  (char *) fbr->alloc_stack + (npages - 1) * pgsz, false)))
                goto fail;
        if (flags & FIBER_FLAG_GUARD_LO)
            fbr->stack = (char *) fbr->alloc_stack + pgsz;
        else
            fbr->stack = fbr->alloc_stack;
    }

    fbr->state = flags;
    fiber_init_(fbr, cleanup, arg);
    return true;

fail:
    free_pages(fbr->alloc_stack);
    return false;
}